

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

void __thiscall HighsIis::report(HighsIis *this,string *message,HighsLp *lp)

{
  value_type vVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  long in_RDX;
  long in_RDI;
  HighsInt iRow;
  HighsInt iCol_3;
  HighsInt iCol_2;
  HighsInt iCol_1;
  HighsInt iCol;
  HighsInt num_iis_row;
  HighsInt num_iis_col;
  string local_80 [32];
  uint local_60;
  HighsInt in_stack_ffffffffffffffa4;
  int bound_status;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffac;
  string local_48 [32];
  int local_28;
  uint local_24;
  int local_20;
  int local_1c;
  long local_18;
  
  local_18 = in_RDX;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
  local_1c = (int)sVar3;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
  local_20 = (int)sVar3;
  if ((local_1c < 0xb) && (local_20 < 0xb)) {
    uVar4 = std::__cxx11::string::c_str();
    printf("\nIIS %s\n===\n",uVar4);
    printf("Column: ");
    for (local_24 = 0; (int)local_24 < local_1c; local_24 = local_24 + 1) {
      printf("%9d ",(ulong)local_24);
    }
    printf("\nStatus: ");
    for (local_28 = 0; local_28 < local_1c; local_28 = local_28 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_28);
      iisBoundStatusToString_abi_cxx11_
                ((HighsIis *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffa4);
      uVar4 = std::__cxx11::string::c_str();
      printf("%9s ",uVar4);
      std::__cxx11::string::~string(local_48);
    }
    printf("\nLower:  ");
    for (iVar6 = 0; iVar6 < local_1c; iVar6 = iVar6 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),(long)iVar6);
      printf("%9.2g ",*pvVar5);
    }
    printf("\nUpper:  ");
    for (bound_status = 0; bound_status < local_1c; bound_status = bound_status + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),
                          (long)bound_status);
      printf("%9.2g ",*pvVar5);
    }
    printf("\n");
    printf("Row:    Status     Lower     Upper\n");
    for (local_60 = 0; uVar2 = local_60, (int)local_60 < local_20; local_60 = local_60 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)(int)local_60);
      iisBoundStatusToString_abi_cxx11_
                ((HighsIis *)CONCAT44(in_stack_ffffffffffffffac,iVar6),bound_status);
      uVar4 = std::__cxx11::string::c_str();
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x50),
                          (long)(int)local_60);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x68),
                          (long)(int)local_60);
      printf("%2d   %9s %9.2g %9.2g\n",vVar1,*pvVar5,(ulong)uVar2,uVar4);
      std::__cxx11::string::~string(local_80);
    }
    printf("\n");
  }
  return;
}

Assistant:

void HighsIis::report(const std::string message, const HighsLp& lp) const {
  HighsInt num_iis_col = this->col_index_.size();
  HighsInt num_iis_row = this->row_index_.size();
  if (num_iis_col > 10 || num_iis_row > 10) return;
  printf("\nIIS %s\n===\n", message.c_str());
  printf("Column: ");
  for (HighsInt iCol = 0; iCol < num_iis_col; iCol++) printf("%9d ", int(iCol));
  printf("\nStatus: ");
  for (HighsInt iCol = 0; iCol < num_iis_col; iCol++)
    printf("%9s ", iisBoundStatusToString(this->col_bound_[iCol]).c_str());
  printf("\nLower:  ");
  for (HighsInt iCol = 0; iCol < num_iis_col; iCol++)
    printf("%9.2g ", lp.col_lower_[iCol]);
  printf("\nUpper:  ");
  for (HighsInt iCol = 0; iCol < num_iis_col; iCol++)
    printf("%9.2g ", lp.col_upper_[iCol]);
  printf("\n");
  printf("Row:    Status     Lower     Upper\n");
  for (HighsInt iRow = 0; iRow < num_iis_row; iRow++)
    printf("%2d   %9s %9.2g %9.2g\n", int(iRow),
           iisBoundStatusToString(this->row_bound_[iRow]).c_str(),
           lp.row_lower_[iRow], lp.row_upper_[iRow]);
  printf("\n");
}